

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O0

CubeFace glu::getCubeFaceFromGL(deUint32 face)

{
  InternalError *this;
  allocator<char> local_31;
  string local_30;
  deUint32 local_10;
  CubeFace local_c;
  deUint32 face_local;
  
  switch(face) {
  case 0x8515:
    local_c = CUBEFACE_POSITIVE_X;
    break;
  case 0x8516:
    local_c = CUBEFACE_NEGATIVE_X;
    break;
  case 0x8517:
    local_c = CUBEFACE_POSITIVE_Y;
    break;
  case 0x8518:
    local_c = CUBEFACE_NEGATIVE_Y;
    break;
  case 0x8519:
    local_c = CUBEFACE_POSITIVE_Z;
    break;
  case 0x851a:
    local_c = CUBEFACE_NEGATIVE_Z;
    break;
  default:
    local_10 = face;
    this = (InternalError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Can\'t map cube face",&local_31);
    tcu::InternalError::InternalError(this,&local_30);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
  }
  return local_c;
}

Assistant:

tcu::CubeFace getCubeFaceFromGL (deUint32 face)
{
	switch (face)
	{
		case GL_TEXTURE_CUBE_MAP_NEGATIVE_X:	return tcu::CUBEFACE_NEGATIVE_X;
		case GL_TEXTURE_CUBE_MAP_POSITIVE_X:	return tcu::CUBEFACE_POSITIVE_X;
		case GL_TEXTURE_CUBE_MAP_NEGATIVE_Y:	return tcu::CUBEFACE_NEGATIVE_Y;
		case GL_TEXTURE_CUBE_MAP_POSITIVE_Y:	return tcu::CUBEFACE_POSITIVE_Y;
		case GL_TEXTURE_CUBE_MAP_NEGATIVE_Z:	return tcu::CUBEFACE_NEGATIVE_Z;
		case GL_TEXTURE_CUBE_MAP_POSITIVE_Z:	return tcu::CUBEFACE_POSITIVE_Z;
		default:
			throw tcu::InternalError("Can't map cube face");
	}
}